

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O1

uint32_t FAudio_INTERNAL_VoiceOutputFrequency(FAudioVoice *voice,FAudioVoiceSends *pSendList)

{
  FAudioVoice *pFVar1;
  FAudioMasteringVoice *pFVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint32_t uVar5;
  double dVar6;
  double dVar7;
  
  if ((pSendList == (FAudioVoiceSends *)0x0) || (pSendList->SendCount == 0)) {
    pFVar2 = voice->audio->master;
  }
  else {
    pFVar1 = pSendList->pSends->pOutputVoice;
    pFVar2 = (FAudioMasteringVoice *)
             (&pFVar1->audio + (ulong)(pFVar1->type != FAUDIO_VOICE_MASTER) * 2);
  }
  dVar7 = (double)(pFVar2->field_19).master.inputSampleRate;
  dVar6 = (double)SDL_ceil(((double)voice->audio->updateSize * dVar7) /
                           (double)(voice->audio->master->field_19).master.inputSampleRate);
  uVar5 = (uint32_t)(long)dVar6;
  if (voice->type == FAUDIO_VOICE_SOURCE) {
    uVar3 = (voice->field_19).src.resampleSamples;
    if (((uVar3 == 0) || (uVar3 == uVar5)) || (uVar3 = 0x88960001, (voice->effects).count == 0)) {
      (voice->field_19).src.resampleSamples = uVar5;
      uVar3 = 0;
    }
  }
  else {
    uVar3 = (voice->field_19).src.resampleSamples;
    if (((uVar3 == 0) || (uVar3 == uVar5)) || (uVar3 = 0x88960001, (voice->effects).count == 0)) {
      (voice->field_19).src.resampleSamples = uVar5;
      dVar7 = ((double)(voice->field_19).mix.inputSampleRate / dVar7) * 4294967296.0 + 0.5;
      uVar4 = (ulong)dVar7;
      uVar4 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
      (voice->field_19).src.resampleStep = uVar4;
      uVar3 = 0;
      if ((voice->field_19).src.decodeSamples / (voice->field_19).mix.inputChannels <
          (uint)(((long)dVar6 & 0xffffffffU) * uVar4 >> 0x20)) {
        (voice->field_19).src.resampleSamples = uVar5 - 1;
      }
    }
  }
  return uVar3;
}

Assistant:

uint32_t FAudio_INTERNAL_VoiceOutputFrequency(
	FAudioVoice *voice,
	const FAudioVoiceSends *pSendList
) {
	uint32_t outSampleRate;
	uint32_t newResampleSamples;
	uint64_t resampleSanityCheck;

	LOG_FUNC_ENTER(voice->audio)

	if ((pSendList == NULL) || (pSendList->SendCount == 0))
	{
		/* When we're deliberately given no sends, use master rate! */
		outSampleRate = voice->audio->master->master.inputSampleRate;
	}
	else
	{
		outSampleRate = pSendList->pSends[0].pOutputVoice->type == FAUDIO_VOICE_MASTER ?
			pSendList->pSends[0].pOutputVoice->master.inputSampleRate :
			pSendList->pSends[0].pOutputVoice->mix.inputSampleRate;
	}
	newResampleSamples = (uint32_t) FAudio_ceil(
		voice->audio->updateSize *
		(double) outSampleRate /
		(double) voice->audio->master->master.inputSampleRate
	);
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		if (	(voice->src.resampleSamples != 0) &&
			(newResampleSamples != voice->src.resampleSamples) &&
			(voice->effects.count > 0)	)
		{
			LOG_FUNC_EXIT(voice->audio)
			return FAUDIO_E_INVALID_CALL;
		}
		voice->src.resampleSamples = newResampleSamples;
	}
	else /* (voice->type == FAUDIO_VOICE_SUBMIX) */
	{
		if (	(voice->mix.outputSamples != 0) &&
			(newResampleSamples != voice->mix.outputSamples) &&
			(voice->effects.count > 0)	)
		{
			LOG_FUNC_EXIT(voice->audio)
			return FAUDIO_E_INVALID_CALL;
		}
		voice->mix.outputSamples = newResampleSamples;

		voice->mix.resampleStep = DOUBLE_TO_FIXED((
			(double) voice->mix.inputSampleRate /
			(double) outSampleRate
		));

		/* Because we used ceil earlier, there's a chance that
		 * downsampling submixes will go past the number of samples
		 * available. Sources can do this thanks to padding, but we
		 * don't have that luxury for submixes, so unfortunately we
		 * just have to undo the ceil and turn it into a floor.
		 * -flibit
		 */
		resampleSanityCheck = (
			voice->mix.resampleStep * voice->mix.outputSamples
		) >> FIXED_PRECISION;
		if (resampleSanityCheck > (voice->mix.inputSamples / voice->mix.inputChannels))
		{
			voice->mix.outputSamples -= 1;
		}
	}

	LOG_FUNC_EXIT(voice->audio)
	return 0;
}